

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

ssize_t __thiscall utf8stream::write(utf8stream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  int carry;
  uchar dst [512];
  int local_23c;
  uchar local_238 [520];
  
  iVar3 = (int)__buf;
  uVar4 = 0;
  if (((iVar3 != 0) && (uVar4 = 0, CONCAT44(in_register_00000034,__fd) != 0)) &&
     (this->writing != false)) {
    for (uVar4 = 0; iVar3 - uVar4 != 0 && (int)uVar4 <= iVar3; uVar4 = uVar4 + local_23c) {
      local_23c = 0;
      uVar1 = encodeutf8(local_238,0x200,
                         (uchar *)(CONCAT44(in_register_00000034,__fd) + (long)(int)uVar4),
                         iVar3 - uVar4,&local_23c);
      if ((0 < (int)uVar1) &&
         (uVar2 = (*this->file->_vptr_stream[10])(this->file,local_238,(ulong)uVar1), uVar2 != uVar1
         )) {
        if (this->writing == true) {
          this->writing = false;
        }
        break;
      }
    }
    this->pos = this->pos + (long)(int)uVar4;
  }
  return (ulong)uVar4;
}

Assistant:

int write(const void *src, int len)
    {
        if(!writing || !src || !len) return 0;
        uchar dst[512];
        int next = 0;
        while(next < len)
        {
            int carry = 0, n = encodeutf8(dst, sizeof(dst), &((uchar *)src)[next], len - next, &carry);
            if(n > 0 && file->write(dst, n) != n) { stopwriting(); break; }
            next += carry;
        }
        pos += next;
        return next;
    }